

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# override.cc
# Opt level: O1

uint4 Override::stringToType(string *nm)

{
  int iVar1;
  uint4 uVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)nm);
  if (iVar1 == 0) {
    uVar2 = 1;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)nm);
    if (iVar1 == 0) {
      uVar2 = 2;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)nm);
      if (iVar1 == 0) {
        uVar2 = 3;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)nm);
        uVar2 = (uint)(iVar1 == 0) << 2;
      }
    }
  }
  return uVar2;
}

Assistant:

uint4 Override::stringToType(const string &nm)

{
  if (nm == "branch")
    return Override::BRANCH;
  else if (nm == "call")
    return Override::CALL;
  else if (nm == "callreturn")
    return Override::CALL_RETURN;
  else if (nm == "return")
    return Override::RETURN;
  return Override::NONE;
}